

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZCompEl * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::ReferredElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this,int64_t mesh)

{
  return (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore[mesh].fEl;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}